

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv.hpp
# Opt level: O0

char * optflag(char ***argv,char *flagname,bool *flag)

{
  int iVar1;
  char *pcVar2;
  char *val_1;
  char *val;
  char *c_fno;
  char *c_f;
  char temp_c_fno [8];
  char temp_c_f [4];
  bool *flag_local;
  char *flagname_local;
  char ***argv_local;
  
  unique0x1000018d = flag;
  if (**argv == (char *)0x0) {
    __assert_fail("*argv != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                  ,0x62,"char *optflag(char **&, const char *, bool *)");
  }
  c_fno = "-f";
  val = "-fno-";
  flag_local = (bool *)flagname;
  if (*flagname == '-') {
    if (flagname[1] != 'f') {
      if (flagname[1] == '\0') {
        __assert_fail("flagname[1] != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                      ,0x6d,"char *optflag(char **&, const char *, bool *)");
      }
      strcpy(temp_c_fno,"-f");
      strcpy((char *)((long)&c_f + 4),"-fno-");
      temp_c_fno[1] = flagname[1];
      c_f._5_1_ = flagname[1];
      c_fno = temp_c_fno;
      val = (char *)((long)&c_f + 4);
    }
    flag_local = (bool *)(flagname + 2);
  }
  if ((stack0xffffffffffffffd8 != (bool *)0x0) && (iVar1 = strncmp(**argv,val,5), iVar1 == 0)) {
    **argv = **argv + 5;
    pcVar2 = optget(argv,(char *)0x0,flag_local,0);
    if (pcVar2 != (char *)0x0) {
      *stack0xffffffffffffffd8 = false;
      return pcVar2;
    }
    **argv = **argv + -5;
  }
  iVar1 = strncmp(**argv,c_fno,2);
  if (iVar1 == 0) {
    **argv = **argv + 2;
    pcVar2 = optget(argv,(char *)0x0,flag_local,0);
    if (pcVar2 != (char *)0x0) {
      if (stack0xffffffffffffffd8 == (bool *)0x0) {
        return pcVar2;
      }
      *stack0xffffffffffffffd8 = true;
      return pcVar2;
    }
    **argv = **argv + -2;
  }
  return (char *)0x0;
}

Assistant:

inline char* optflag(char**& argv, const char* flagname, bool* flag)
{
    assert(*argv != nullptr);

    char temp_c_f[4], temp_c_fno[8];
    const char* c_f   = "-f";
    const char* c_fno = "-fno-";

    // in case one wants to use e.g. -m instead of -f
    if(flagname[0] == '-')
    {
        if(flagname[1] != 'f')
        {
            assert(flagname[1] != 0);

            strcpy(temp_c_f, c_f);
            strcpy(temp_c_fno, c_fno);
            temp_c_f[1] = flagname[1];
            temp_c_fno[1] = flagname[1];

            c_f = temp_c_f;
            c_fno = temp_c_fno;
        }

        flagname += 2;
    }

    if(flag && !strncmp(*argv, c_fno, 5))
    {
        *argv += 5;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            *flag = false;
            return val;
        }
        else
        {
            *argv -= 5;
        }
    }

    if(!strncmp(*argv, c_f, 2))
    {
        *argv += 2;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            if(flag) *flag = true;
            return val;
        }
        else
        {
            *argv -= 2;
        }
    }

    return nullptr;
}